

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::SetProperty(cmMakefile *this,string *prop,char *value)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  cmValueWithOrigin entry;
  allocator local_c9;
  string local_c8;
  cmListFileBacktrace local_a8;
  cmValueWithOrigin local_78;
  
  bVar1 = std::operator==(prop,"LINK_DIRECTORIES");
  if (bVar1) {
    local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (value != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_78,value,(allocator *)&local_c8);
      cmSystemTools::ExpandListArgument
                (&local_78.Value,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_a8,false);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->LinkDirectories,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
    return;
  }
  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar1) {
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::clear
              (&this->IncludeDirectoriesEntries);
    if (value == (char *)0x0) {
      return;
    }
    GetBacktrace(&local_a8,this);
    std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
    cmValueWithOrigin::cmValueWithOrigin(&local_78,&local_c8,&local_a8);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
    emplace_back<cmValueWithOrigin>(&this->IncludeDirectoriesEntries,&local_78);
  }
  else {
    bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
    if (!bVar1) {
      bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
      if (!bVar1) {
        bVar1 = std::operator==(prop,"INCLUDE_REGULAR_EXPRESSION");
        if (bVar1) {
          std::__cxx11::string::assign((char *)&this->IncludeFileRegularExpression);
          return;
        }
        bVar1 = std::operator==(prop,"ADDITIONAL_MAKE_CLEAN_FILES");
        if (bVar1) {
          __s1 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
          __s2 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
          iVar2 = strcmp(__s1,__s2);
          if (iVar2 != 0) {
            return;
          }
        }
        cmPropertyMap::SetProperty(&this->Properties,prop,value);
        return;
      }
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::clear
                (&this->CompileDefinitionsEntries);
      if (value == (char *)0x0) {
        return;
      }
      GetBacktrace(&local_a8,this);
      std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
      cmValueWithOrigin::cmValueWithOrigin(&local_78,&local_c8,&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                (&this->CompileDefinitionsEntries,&local_78);
      cmValueWithOrigin::~cmValueWithOrigin(&local_78);
      goto LAB_00351e47;
    }
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::clear
              (&this->CompileOptionsEntries);
    if (value == (char *)0x0) {
      return;
    }
    GetBacktrace(&local_a8,this);
    std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
    cmValueWithOrigin::cmValueWithOrigin(&local_78,&local_c8,&local_a8);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
    emplace_back<cmValueWithOrigin>(&this->CompileOptionsEntries,&local_78);
  }
  cmValueWithOrigin::~cmValueWithOrigin(&local_78);
  std::__cxx11::string::~string((string *)&local_c8);
LAB_00351e47:
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void cmMakefile::SetProperty(const std::string& prop, const char* value)
{
  if ( prop == "LINK_DIRECTORIES" )
    {
    std::vector<std::string> varArgsExpanded;
    if(value)
      {
      cmSystemTools::ExpandListArgument(value, varArgsExpanded);
      }
    this->SetLinkDirectories(varArgsExpanded);
    return;
    }
  if (prop == "INCLUDE_DIRECTORIES")
    {
    this->IncludeDirectoriesEntries.clear();
      if (!value)
        {
        return;
        }
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->IncludeDirectoriesEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_OPTIONS")
    {
    this->CompileOptionsEntries.clear();
      if (!value)
        {
        return;
        }
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->CompileOptionsEntries.push_back(cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_DEFINITIONS")
    {
    this->CompileDefinitionsEntries.clear();
    if (!value)
      {
      return;
      }
    cmListFileBacktrace lfbt = this->GetBacktrace();
    cmValueWithOrigin entry(value, lfbt);
    this->CompileDefinitionsEntries.push_back(entry);
    return;
    }

  if ( prop == "INCLUDE_REGULAR_EXPRESSION" )
    {
    this->SetIncludeRegularExpression(value);
    return;
    }

  if ( prop == "ADDITIONAL_MAKE_CLEAN_FILES" )
    {
    // This property is not inherrited
    if ( strcmp(this->GetCurrentSourceDirectory(),
                this->GetCurrentSourceDirectory()) != 0 )
      {
      return;
      }
    }

  this->Properties.SetProperty(prop, value);
}